

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall Highs::handleInfCost(Highs *this)

{
  double dVar1;
  HighsLogOptions *log_options_;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RDI;
  double upper;
  double lower;
  double cost;
  HighsInt iCol;
  HighsInt k;
  double inf_cost;
  HighsLpMods *mods;
  HighsLp *lp;
  HighsLp *in_stack_ffffffffffffff98;
  HighsLp *in_stack_ffffffffffffffa0;
  double local_48;
  HighsLp *local_40;
  uint local_30;
  int local_2c;
  
  if ((*(byte *)(in_RDI + 0x390) & 1) != 0) {
    dVar1 = *(double *)(in_RDI + 0xba0);
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      for (local_30 = 0; (int)local_30 < *(int *)(in_RDI + 0x138); local_30 = local_30 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                            (long)(int)local_30);
        log_options_ = (HighsLogOptions *)*pvVar3;
        if (((double)log_options_ <= -dVar1) || (dVar1 <= (double)log_options_)) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x158),
                              (long)(int)local_30);
          local_40 = (HighsLp *)*pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x170),
                              (long)(int)local_30);
          local_48 = *pvVar3;
          bVar2 = HighsLp::isMip(in_stack_ffffffffffffff98);
          if ((bVar2) &&
             (pvVar4 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                                 ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                                  (in_RDI + 0x2b0),(long)(int)local_30), *pvVar4 == kInteger)) {
            local_40 = (HighsLp *)ceil((double)local_40);
            local_48 = floor(local_48);
          }
          if (-dVar1 < (double)log_options_) {
            if (*(int *)(in_RDI + 0x228) == 1) {
              if ((double)local_40 <= -INFINITY) {
                highsLogUser(log_options_,(HighsLogType)local_40,(char *)(in_RDI + 0xe28),5,
                             "Cannot minimize with a cost on variable %d of %g and lower bound of %g\n"
                             ,(ulong)local_30);
                return kError;
              }
              if (local_2c != 0) {
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x170),
                                    (long)(int)local_30);
                *pvVar3 = (value_type)local_40;
                in_stack_ffffffffffffff98 = local_40;
              }
            }
            else {
              if (INFINITY <= local_48) {
                highsLogUser(log_options_,(HighsLogType)local_48,(char *)(in_RDI + 0xe28),5,
                             "Cannot maximize with a cost on variable %d of %g and upper bound of %g\n"
                             ,(ulong)local_30);
                return kError;
              }
              if (local_2c != 0) {
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x158),
                                    (long)(int)local_30);
                *pvVar3 = local_48;
              }
            }
          }
          else if (*(int *)(in_RDI + 0x228) == 1) {
            if (INFINITY <= local_48) {
              highsLogUser(log_options_,(HighsLogType)local_48,(char *)(in_RDI + 0xe28),5,
                           "Cannot minimize with a cost on variable %d of %g and upper bound of %g\n"
                           ,(ulong)local_30);
              return kError;
            }
            if (local_2c != 0) {
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x158),
                                  (long)(int)local_30);
              *pvVar3 = local_48;
            }
          }
          else {
            if ((double)local_40 <= -INFINITY) {
              highsLogUser(log_options_,(HighsLogType)local_40,(char *)(in_RDI + 0xe28),5,
                           "Cannot maximize with a cost on variable %d of %g and lower bound of %g\n"
                           ,(ulong)local_30);
              return kError;
            }
            if (local_2c != 0) {
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x170),
                                  (long)(int)local_30);
              *pvVar3 = (value_type)local_40;
              in_stack_ffffffffffffffa0 = local_40;
            }
          }
          if (local_2c != 0) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                       &in_stack_ffffffffffffff98->num_col_);
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffa0,
                       (value_type_conflict1 *)in_stack_ffffffffffffff98);
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffa0,
                       (value_type_conflict1 *)in_stack_ffffffffffffff98);
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffa0,
                       (value_type_conflict1 *)in_stack_ffffffffffffff98);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                                (long)(int)local_30);
            *pvVar3 = 0.0;
          }
        }
      }
    }
    *(undefined1 *)(in_RDI + 0x390) = 0;
  }
  return kOk;
}

Assistant:

HighsStatus Highs::handleInfCost() {
  HighsLp& lp = this->model_.lp_;
  if (!lp.has_infinite_cost_) return HighsStatus::kOk;
  HighsLpMods& mods = lp.mods_;
  double inf_cost = this->options_.infinite_cost;
  for (HighsInt k = 0; k < 2; k++) {
    // Pass twice: first checking that infinite costs can be handled,
    // then handling them, so that model is unmodified if infinite
    // costs cannot be handled
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      double cost = lp.col_cost_[iCol];
      if (cost > -inf_cost && cost < inf_cost) continue;
      double lower = lp.col_lower_[iCol];
      double upper = lp.col_upper_[iCol];
      if (lp.isMip()) {
        if (lp.integrality_[iCol] == HighsVarType::kInteger) {
          lower = std::ceil(lower);
          upper = std::floor(upper);
        }
      }
      if (cost <= -inf_cost) {
        if (lp.sense_ == ObjSense::kMinimize) {
          // Minimizing with -inf cost so try to fix at upper bound
          if (upper < kHighsInf) {
            if (k) lp.col_lower_[iCol] = upper;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot minimize with a cost on variable %d of %g and "
                         "upper bound of %g\n",
                         int(iCol), cost, upper);
            return HighsStatus::kError;
          }
        } else {
          // Maximizing with -inf cost so try to fix at lower bound
          if (lower > -kHighsInf) {
            if (k) lp.col_upper_[iCol] = lower;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot maximize with a cost on variable %d of %g and "
                         "lower bound of %g\n",
                         int(iCol), cost, lower);
            return HighsStatus::kError;
          }
        }
      } else {
        if (lp.sense_ == ObjSense::kMinimize) {
          // Minimizing with inf cost so try to fix at lower bound
          if (lower > -kHighsInf) {
            if (k) lp.col_upper_[iCol] = lower;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot minimize with a cost on variable %d of %g and "
                         "lower bound of %g\n",
                         int(iCol), cost, lower);
            return HighsStatus::kError;
          }
        } else {
          // Maximizing with inf cost so try to fix at upper bound
          if (upper < kHighsInf) {
            if (k) lp.col_lower_[iCol] = upper;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot maximize with a cost on variable %d of %g and "
                         "upper bound of %g\n",
                         int(iCol), cost, upper);
            return HighsStatus::kError;
          }
        }
      }
      if (k) {
        mods.save_inf_cost_variable_index.push_back(iCol);
        mods.save_inf_cost_variable_cost.push_back(cost);
        mods.save_inf_cost_variable_lower.push_back(lower);
        mods.save_inf_cost_variable_upper.push_back(upper);
        lp.col_cost_[iCol] = 0;
      }
    }
  }
  // Infinite costs have been removed, but their presence in the
  // original model is known from mods.save_inf_cost_variable_*, so
  // set lp.has_infinite_cost_ to be false to avoid assert when run()
  // is called using copy of model in MIP solver (See #1446)
  lp.has_infinite_cost_ = false;

  return HighsStatus::kOk;
}